

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

Debug * Corrade::Utility::operator<<(Debug *debug,Flags value)

{
  Debug *pDVar1;
  undefined7 in_register_00000031;
  size_type in_R9;
  initializer_list<Corrade::Utility::Debug::Flag> enums;
  char local_6 [6];
  
  enums._M_len = in_R9;
  enums._M_array = (iterator)0x6;
  pDVar1 = Containers::enumSetDebugOutput<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_>
                     ((Containers *)debug,(Debug *)CONCAT71(in_register_00000031,value._value),
                      (EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_>)0x60,local_6,
                      enums);
  return pDVar1;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Flags value) {
    return Containers::enumSetDebugOutput(debug, value, "Utility::Debug::Flags{}", {
        Debug::Flag::NoNewlineAtTheEnd,
        Debug::Flag::DisableColors,
        Debug::Flag::NoSpace,
        Debug::Flag::Packed,
        Debug::Flag::Color,
        /* Space reserved for Bin and Oct */
        Debug::Flag::Hex});
}